

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsc.c
# Opt level: O2

bsc_step_t
bsc_scan_qtree_single
          (bsc_step_t depends,bsc_group_t group,void *src,void *dst,void *tmp_space,
          bsc_reduce_t reducer,void *zero,bsc_size_t nmemb,bsc_size_t size,int q)

{
  bsp_pid_t bVar1;
  int iVar2;
  int iVar3;
  bsc_pid_t dst_pid;
  void *pvVar4;
  void *a;
  bsc_pid_t dst_pid_00;
  int iVar5;
  long lVar6;
  void *src_00;
  int iVar7;
  bsc_size_t offset;
  bool bVar8;
  bsc_step_t local_9c;
  uint local_38;
  
  if (group == (bsc_group_t)0x0) {
    iVar2 = bsp_nprocs();
    iVar3 = bsp_pid();
  }
  else {
    iVar2 = *group;
    lVar6 = *(long *)((long)group + 8);
    bVar1 = bsp_pid();
    iVar3 = *(int *)(lVar6 + (long)bVar1 * 4);
  }
  pvVar4 = (void *)((long)((nmemb + -1) * size) + (long)dst);
  if (nmemb == 0) {
    pvVar4 = zero;
  }
  a = (void *)((long)(iVar2 * size) + (long)tmp_space);
  (*reducer)(dst,zero,src,nmemb * size);
  iVar5 = 0;
  local_9c = depends;
  for (iVar7 = 1; iVar7 < iVar2; iVar7 = iVar7 * q) {
    bVar8 = iVar7 == 1;
    src_00 = pvVar4;
    if ((!bVar8) && (src_00 = (void *)((long)((iVar5 + -1) * size) + (long)a), iVar5 == 0)) {
      src_00 = zero;
    }
    dst_pid = iVar3 + (uint)bVar8;
    offset = size;
    iVar5 = dst_pid;
    for (lVar6 = 1; iVar5 = iVar5 + iVar7, lVar6 < q; lVar6 = lVar6 + 1) {
      if (iVar5 < iVar2) {
        dst_pid_00 = iVar5;
        if (group != (bsc_group_t)0x0) {
          dst_pid_00 = *(bsc_pid_t *)(*(long *)((long)group + 0x10) + (long)iVar5 * 4);
        }
        bsc_put(local_9c,dst_pid_00,src_00,tmp_space,offset,size);
      }
      offset = offset + size;
    }
    iVar5 = (int)((iVar7 - (uint)bVar8) + iVar3) / iVar7;
    if (q <= iVar5) {
      iVar5 = q;
    }
    local_38 = (uint)bVar8;
    if (iVar3 < (int)(iVar2 - local_38)) {
      if (group != (bsc_group_t)0x0) {
        dst_pid = *(bsc_pid_t *)(*(long *)((long)group + 0x10) + (long)dst_pid * 4);
      }
      bsc_put(local_9c,dst_pid,src_00,tmp_space,0,size);
    }
    bsc_exec_reduce(local_9c,reducer,a,zero,tmp_space,iVar5 * size);
    local_9c = local_9c + 1;
  }
  if (0 < iVar5) {
    zero = (void *)((long)a + (long)((iVar5 + -1) * size));
  }
  bVar1 = bsp_pid();
  bsc_put(local_9c,bVar1,zero,tmp_space,0,size);
  bsc_exec_reduce(local_9c,reducer,dst,tmp_space,src,nmemb * size);
  return local_9c + 1;
}

Assistant:

DLL_PUBLIC bsc_step_t bsc_scan_qtree_single( bsc_step_t depends, 
        bsc_group_t group, const void * src, void * dst, void * tmp_space, 
        bsc_reduce_t reducer, const void * zero,
        bsc_size_t nmemb, bsc_size_t size,
        int q )
{
    const group_t * g = group;
    bsc_pid_t i, j, k=0, P = g?g->size:bsp_nprocs() ;
    bsc_pid_t range, s = g?g->lid[bsp_pid()]:bsp_pid();
    char * dst_bytes = dst;
    char * tmp1 = tmp_space;
    char * tmp2 = tmp1 + P * size;
    const void * prefix;

    (*reducer)( dst, zero, src, size * nmemb );

    for (range = 1; range < P; range *= q ) {
        const bsc_size_t shift = (range==1);
        const void * last = NULL;
        if (range == 1)
            last = (nmemb==0 ? zero : &dst_bytes[(nmemb-1)*size]);
        else
            last = (k==0 ? zero : &tmp2[(k-1)*size]);

        for ( i = 1; i < q; ++i ) {
            j = s + range * i + shift;
            if ( j < P ) {
                bsc_put( depends, g?g->gid[j]:j, last, tmp1, i * size, size);
            }
        }
    
        /* k is number of received elements */
        k = MIN( q, (range+s-shift)/range);

        if (s < P - shift) {
            j = g?g->gid[s+shift]:s+shift;
            bsc_put(depends, j, last, tmp1, 0, size);
        }
        bsc_exec_reduce( depends, reducer, tmp2, zero, tmp1, size*k );
        depends += 1;
    }

    prefix = k > 0 ? &tmp2[(k-1)*size] : zero ;
    bsc_put(depends, bsp_pid(), prefix, tmp1, 0, size);

    bsc_exec_reduce( depends, reducer, dst, tmp1, src, size*nmemb );
    return depends+1;
}